

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O1

unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> __thiscall
duckdb::RowGroup::AlterType
          (RowGroup *this,RowGroupCollection *new_collection,LogicalType *target_type,
          idx_t changed_idx,ExpressionExecutor *executor,CollectionScanState *scan_state,
          DataChunk *scan_chunk)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  BlockManager *block_manager;
  undefined8 uVar2;
  undefined8 uVar3;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> uVar4;
  type info;
  ColumnData *pCVar5;
  Allocator *allocator;
  reference result;
  RowGroup *this_00;
  pointer pRVar6;
  vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true> *this_01;
  reference __x;
  ExpressionExecutor *__n;
  templated_unique_single_t *row_group;
  shared_ptr<duckdb::ColumnData,_true> column_data;
  ColumnAppendState append_state;
  vector<duckdb::LogicalType,_true> append_types;
  DataChunk append_chunk;
  undefined1 local_f8 [56];
  CollectionScanState *local_c0;
  ColumnAppendState local_b8;
  undefined1 local_88 [24];
  DataChunk local_70;
  
  p_Var1 = (new_collection->info).internal.
           super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  block_manager = (BlockManager *)p_Var1->_vptr__Sp_counted_base;
  local_f8._40_8_ = target_type;
  local_c0 = scan_state;
  info = shared_ptr<duckdb::DataTableInfo,_true>::operator*
                   ((shared_ptr<duckdb::DataTableInfo,_true> *)&p_Var1[1]._M_use_count);
  local_f8._48_8_ = executor;
  ColumnData::CreateColumn
            ((ColumnData *)local_f8,block_manager,info,(idx_t)executor,
             (idx_t)new_collection->block_manager,(LogicalType *)changed_idx,
             (optional_ptr<duckdb::ColumnData,_true>)0x0);
  local_b8.append_state.
  super_unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::CompressionAppendState_*,_std::default_delete<duckdb::CompressionAppendState>_>
  .super__Head_base<0UL,_duckdb::CompressionAppendState_*,_false>._M_head_impl =
       (unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
        )(__uniq_ptr_data<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>,_true,_true>
          )0x0;
  local_b8.child_appends.
  super_vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>.
  super__Vector_base<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.lock.
  super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
  super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>.
  super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl =
       (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
       (__uniq_ptr_data<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true,_true>
        )0x0;
  local_b8.child_appends.
  super_vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>.
  super__Vector_base<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.child_appends.
  super_vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>.
  super__Vector_base<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pCVar5 = shared_ptr<duckdb::ColumnData,_true>::operator->
                     ((shared_ptr<duckdb::ColumnData,_true> *)local_f8);
  (*pCVar5->_vptr_ColumnData[0x11])(pCVar5,&local_b8);
  CollectionScanState::Initialize
            ((CollectionScanState *)scan_chunk,
             (vector<duckdb::LogicalType,_true> *)
             &(new_collection->info).internal.
              super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi[2]._M_use_count);
  InitializeScan((RowGroup *)new_collection,(CollectionScanState *)scan_chunk);
  DataChunk::DataChunk((DataChunk *)(local_88 + 0x18));
  local_88._0_8_ = 0;
  local_88._8_8_ = 0;
  local_88._16_8_ = 0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_88,
             (value_type *)changed_idx);
  allocator = Allocator::DefaultAllocator();
  DataChunk::Initialize
            ((DataChunk *)(local_88 + 0x18),allocator,(vector<duckdb::LogicalType,_true> *)local_88,
             0x800);
  result = vector<duckdb::Vector,_true>::operator[]
                     ((vector<duckdb::Vector,_true> *)(local_88 + 0x18),0);
  while( true ) {
    DataChunk::Reset((DataChunk *)row_group);
    ScanCommitted((RowGroup *)new_collection,(CollectionScanState *)scan_chunk,
                  (DataChunk *)row_group,TABLE_SCAN_COMMITTED_ROWS);
    if (row_group[3].super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t
        .super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
        super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl == (RowGroup *)0x0) break;
    DataChunk::Reset((DataChunk *)(local_88 + 0x18));
    ExpressionExecutor::ExecuteExpression
              ((ExpressionExecutor *)local_c0,(DataChunk *)row_group,result);
    pCVar5 = shared_ptr<duckdb::ColumnData,_true>::operator->
                       ((shared_ptr<duckdb::ColumnData,_true> *)local_f8);
    ColumnData::Append(pCVar5,&local_b8,result,
                       (idx_t)row_group[3].
                              super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>
                              .super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl);
  }
  this_00 = (RowGroup *)operator_new(200);
  RowGroup(this_00,(RowGroupCollection *)local_f8._40_8_,(idx_t)new_collection->block_manager,
           new_collection->row_group_size);
  (this->super_SegmentBase<duckdb::RowGroup>).start = (idx_t)this_00;
  pRVar6 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                     ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
                      this);
  GetOrCreateVersionInfoPtr((RowGroup *)(local_f8 + 0x10));
  uVar3 = local_f8._24_8_;
  uVar2 = local_f8._16_8_;
  local_f8._16_8_ = 0;
  local_f8._24_8_ = (BlockManager *)0x0;
  p_Var1 = (pRVar6->owned_version_info).internal.
           super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (pRVar6->owned_version_info).internal.
  super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  (pRVar6->owned_version_info).internal.
  super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  LOCK();
  (pRVar6->version_info)._M_i.ptr =
       (pRVar6->owned_version_info).internal.
       super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  UNLOCK();
  if ((BlockManager *)local_f8._24_8_ != (BlockManager *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._24_8_);
  }
  this_01 = GetColumns((RowGroup *)new_collection);
  if ((this_01->
      super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
      ).
      super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this_01->
      super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
      ).
      super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = (ExpressionExecutor *)0x0;
    do {
      if ((ExpressionExecutor *)local_f8._48_8_ == __n) {
        pRVar6 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::
                 operator->((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>
                             *)this);
        ::std::
        vector<duckdb::shared_ptr<duckdb::ColumnData,true>,std::allocator<duckdb::shared_ptr<duckdb::ColumnData,true>>>
        ::emplace_back<duckdb::shared_ptr<duckdb::ColumnData,true>>
                  ((vector<duckdb::shared_ptr<duckdb::ColumnData,true>,std::allocator<duckdb::shared_ptr<duckdb::ColumnData,true>>>
                    *)&pRVar6->columns,(shared_ptr<duckdb::ColumnData,_true> *)local_f8);
        uVar2 = local_f8._8_8_;
        local_f8._0_8_ = (element_type *)0x0;
        local_f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
        }
      }
      else {
        pRVar6 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::
                 operator->((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>
                             *)this);
        __x = vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true>::operator[]
                        (this_01,(size_type)__n);
        ::std::
        vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
        ::push_back(&(pRVar6->columns).
                     super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                    ,__x);
      }
      __n = (ExpressionExecutor *)
            ((long)&(__n->expressions).
                    super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                    .
                    super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1);
    } while (__n < (ExpressionExecutor *)
                   ((long)(this_01->
                          super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                          ).
                          super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this_01->
                          super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                          ).
                          super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
            ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)this);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_88);
  DataChunk::~DataChunk((DataChunk *)(local_88 + 0x18));
  if ((_Head_base<0UL,_duckdb::CompressionAppendState_*,_false>)
      local_b8.append_state.
      super_unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::CompressionAppendState_*,_std::default_delete<duckdb::CompressionAppendState>_>
      .super__Head_base<0UL,_duckdb::CompressionAppendState_*,_false>._M_head_impl !=
      (_Head_base<0UL,_duckdb::CompressionAppendState_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_b8.append_state.
        super_unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::CompressionAppendState_*,_std::default_delete<duckdb::CompressionAppendState>_>
        .super__Head_base<0UL,_duckdb::CompressionAppendState_*,_false>._M_head_impl)[1])();
  }
  uVar4.super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
  super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>.
  super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl =
       (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
       (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
       local_b8.lock;
  local_b8.append_state.
  super_unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::CompressionAppendState_*,_std::default_delete<duckdb::CompressionAppendState>_>
  .super__Head_base<0UL,_duckdb::CompressionAppendState_*,_false>._M_head_impl =
       (unique_ptr<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>_>
        )(__uniq_ptr_data<duckdb::CompressionAppendState,_std::default_delete<duckdb::CompressionAppendState>,_true,_true>
          )0x0;
  if (local_b8.lock.
      super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
      super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>
      .super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true,_true>
       )0x0) {
    StorageLockKey::~StorageLockKey
              ((StorageLockKey *)
               local_b8.lock.
               super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>
               .super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl);
    operator_delete((void *)uVar4.
                            super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>
                            .super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl);
  }
  local_b8.lock.
  super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
  super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>.
  super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl =
       (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
       (__uniq_ptr_data<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true,_true>
        )0x0;
  ::std::vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>::~vector
            (&local_b8.child_appends.
              super_vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
  }
  return (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)
         (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)this;
}

Assistant:

unique_ptr<RowGroup> RowGroup::AlterType(RowGroupCollection &new_collection, const LogicalType &target_type,
                                         idx_t changed_idx, ExpressionExecutor &executor,
                                         CollectionScanState &scan_state, DataChunk &scan_chunk) {
	Verify();

	// construct a new column data for this type
	auto column_data = ColumnData::CreateColumn(GetBlockManager(), GetTableInfo(), changed_idx, start, target_type);

	ColumnAppendState append_state;
	column_data->InitializeAppend(append_state);

	// scan the original table, and fill the new column with the transformed value
	scan_state.Initialize(GetCollection().GetTypes());
	InitializeScan(scan_state);

	DataChunk append_chunk;
	vector<LogicalType> append_types;
	append_types.push_back(target_type);
	append_chunk.Initialize(Allocator::DefaultAllocator(), append_types);
	auto &append_vector = append_chunk.data[0];
	while (true) {
		// scan the table
		scan_chunk.Reset();
		ScanCommitted(scan_state, scan_chunk, TableScanType::TABLE_SCAN_COMMITTED_ROWS);
		if (scan_chunk.size() == 0) {
			break;
		}
		// execute the expression
		append_chunk.Reset();
		executor.ExecuteExpression(scan_chunk, append_vector);
		column_data->Append(append_state, append_vector, scan_chunk.size());
	}

	// set up the row_group based on this row_group
	auto row_group = make_uniq<RowGroup>(new_collection, this->start, this->count);
	row_group->SetVersionInfo(GetOrCreateVersionInfoPtr());
	auto &cols = GetColumns();
	for (idx_t i = 0; i < cols.size(); i++) {
		if (i == changed_idx) {
			// this is the altered column: use the new column
			row_group->columns.push_back(std::move(column_data));
			column_data.reset();
		} else {
			// this column was not altered: use the data directly
			row_group->columns.push_back(cols[i]);
		}
	}
	row_group->Verify();
	return row_group;
}